

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsBuiltinPrecisionTests.cpp
# Opt level: O0

void __thiscall
deqp::gls::BuiltinPrecisionTests::
Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<tcu::Vector<float,_4>_>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
::Tuple4(Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<tcu::Vector<float,_4>_>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
         *this,ExprP<tcu::Vector<float,_4>_> *e0,ExprP<float> *e1,
        ExprP<deqp::gls::BuiltinPrecisionTests::Void> *e2,
        ExprP<deqp::gls::BuiltinPrecisionTests::Void> *e3)

{
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *e3_local;
  ExprP<deqp::gls::BuiltinPrecisionTests::Void> *e2_local;
  ExprP<float> *e1_local;
  ExprP<tcu::Vector<float,_4>_> *e0_local;
  Tuple4<deqp::gls::BuiltinPrecisionTests::ExprP<tcu::Vector<float,_4>_>,_deqp::gls::BuiltinPrecisionTests::ExprP<float>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>,_deqp::gls::BuiltinPrecisionTests::ExprP<deqp::gls::BuiltinPrecisionTests::Void>_>
  *this_local;
  
  ExprP<tcu::Vector<float,_4>_>::ExprP(&this->a,e0);
  ExprP<float>::ExprP(&this->b,e1);
  ExprP<deqp::gls::BuiltinPrecisionTests::Void>::ExprP(&this->c,e2);
  ExprP<deqp::gls::BuiltinPrecisionTests::Void>::ExprP(&this->d,e3);
  return;
}

Assistant:

explicit Tuple4 (const T0& e0 = T0(),
					 const T1& e1 = T1(),
					 const T2& e2 = T2(),
					 const T3& e3 = T3())
		: a	(e0)
		, b	(e1)
		, c	(e2)
		, d	(e3)
	{
	}